

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall UniformFunction::UniformFunction(UniformFunction *this)

{
  UniformFunction *this_local;
  
  std::function<void_(vera::Shader_&)>::function(&this->assign);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&this->print);
  std::__cxx11::string::string((string *)&this->type);
  this->present = false;
  std::__cxx11::string::operator=((string *)&this->type,"-undefined-");
  return;
}

Assistant:

UniformFunction::UniformFunction() {
    type = "-undefined-";
}